

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O0

sds sdscatfmt(sds s,char *fmt,...)

{
  char cVar1;
  char *s_00;
  char in_AL;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unsigned_long_long *local_1e8;
  uint *local_1d0;
  unsigned_long_long *local_1b8;
  int *local_1a0;
  ulong local_188;
  undefined8 *local_180;
  unsigned_long_long local_158 [4];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  char local_a8 [8];
  char buf_1 [21];
  char local_88 [8];
  char buf [21];
  unsigned_long_long unum;
  longlong num;
  size_t l;
  char *str;
  uint local_48;
  char next;
  va_list ap;
  long i;
  char *f;
  size_t initlen;
  char *fmt_local;
  sds s_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_158[2] = in_RDX;
  local_158[3] = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  ap[0].reg_save_area = (void *)sdslen(s);
  sVar3 = strlen(fmt);
  fmt_local = sdsMakeRoomFor(s,(size_t)((long)ap[0].reg_save_area + sVar3 * 2));
  ap[0]._0_8_ = &stack0x00000008;
  local_48 = 0x10;
  i = (long)fmt;
  do {
    if (*(char *)i == '\0') {
      fmt_local[(long)ap[0].reg_save_area] = '\0';
      return fmt_local;
    }
    sVar4 = sdsavail(fmt_local);
    if (sVar4 == 0) {
      fmt_local = sdsMakeRoomFor(fmt_local,1);
    }
    if (*(char *)i == '%') {
      cVar1 = *(char *)(i + 1);
      if (cVar1 != '\0') {
        i = i + 1;
        if (cVar1 == 'I') {
LAB_0010d6e5:
          if (cVar1 == 'i') {
            if (local_48 < 0x29) {
              local_1a0 = (int *)((long)local_158 + (long)(int)local_48);
              local_48 = local_48 + 8;
            }
            else {
              local_1a0 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            unum = (unsigned_long_long)*local_1a0;
          }
          else {
            if (local_48 < 0x29) {
              local_1b8 = (unsigned_long_long *)((long)local_158 + (long)(int)local_48);
              local_48 = local_48 + 8;
            }
            else {
              local_1b8 = (unsigned_long_long *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            unum = *local_1b8;
          }
          iVar2 = sdsll2str(local_88,unum);
          uVar5 = (ulong)iVar2;
          sVar4 = sdsavail(fmt_local);
          if (sVar4 < uVar5) {
            fmt_local = sdsMakeRoomFor(fmt_local,uVar5);
          }
          memcpy(fmt_local + (long)ap[0].reg_save_area,local_88,uVar5);
          sdsinclen(fmt_local,uVar5);
          ap[0].reg_save_area = (void *)(uVar5 + (long)ap[0].reg_save_area);
        }
        else if (cVar1 == 'S') {
LAB_0010d5f6:
          if (local_48 < 0x29) {
            local_180 = (undefined8 *)((long)local_158 + (long)(int)local_48);
            local_48 = local_48 + 8;
          }
          else {
            local_180 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          s_00 = (char *)*local_180;
          if (cVar1 == 's') {
            local_188 = strlen(s_00);
          }
          else {
            local_188 = sdslen(s_00);
          }
          sVar4 = sdsavail(fmt_local);
          if (sVar4 < local_188) {
            fmt_local = sdsMakeRoomFor(fmt_local,local_188);
          }
          memcpy(fmt_local + (long)ap[0].reg_save_area,s_00,local_188);
          sdsinclen(fmt_local,local_188);
          ap[0].reg_save_area = (void *)(local_188 + (long)ap[0].reg_save_area);
        }
        else {
          if (cVar1 != 'U') {
            if (cVar1 == 'i') goto LAB_0010d6e5;
            if (cVar1 == 's') goto LAB_0010d5f6;
            if (cVar1 != 'u') {
              fmt_local[(long)ap[0].reg_save_area] = cVar1;
              sdsinclen(fmt_local,1);
              ap[0].reg_save_area = (void *)((long)ap[0].reg_save_area + 1);
              goto LAB_0010d9b4;
            }
          }
          if (cVar1 == 'u') {
            if (local_48 < 0x29) {
              local_1d0 = (uint *)((long)local_158 + (long)(int)local_48);
              local_48 = local_48 + 8;
            }
            else {
              local_1d0 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            register0x00000000 = (unsigned_long_long)*local_1d0;
          }
          else {
            if (local_48 < 0x29) {
              local_1e8 = (unsigned_long_long *)((long)local_158 + (long)(int)local_48);
              local_48 = local_48 + 8;
            }
            else {
              local_1e8 = (unsigned_long_long *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            unique0x00012000 = *local_1e8;
          }
          iVar2 = sdsull2str(local_a8,stack0xffffffffffffff90);
          uVar5 = (ulong)iVar2;
          sVar4 = sdsavail(fmt_local);
          if (sVar4 < uVar5) {
            fmt_local = sdsMakeRoomFor(fmt_local,uVar5);
          }
          memcpy(fmt_local + (long)ap[0].reg_save_area,local_a8,uVar5);
          sdsinclen(fmt_local,uVar5);
          ap[0].reg_save_area = (void *)(uVar5 + (long)ap[0].reg_save_area);
        }
      }
    }
    else {
      fmt_local[(long)ap[0].reg_save_area] = *(char *)i;
      sdsinclen(fmt_local,1);
      ap[0].reg_save_area = (void *)((long)ap[0].reg_save_area + 1);
    }
LAB_0010d9b4:
    i = i + 1;
  } while( true );
}

Assistant:

sds sdscatfmt(sds s, char const *fmt, ...) {
    size_t initlen = sdslen(s);
    const char *f = fmt;
    long i;
    va_list ap;

    /* To avoid continuous reallocations, let's start with a buffer that
     * can hold at least two times the format string itself. It's not the
     * best heuristic but seems to work in practice. */
    s = sdsMakeRoomFor(s, initlen + strlen(fmt)*2);
    va_start(ap,fmt);
    f = fmt;    /* Next format specifier byte to process. */
    i = initlen; /* Position of the next byte to write to dest str. */
    while(*f) {
        char next, *str;
        size_t l;
        long long num;
        unsigned long long unum;

        /* Make sure there is always space for at least 1 char. */
        if (sdsavail(s)==0) {
            s = sdsMakeRoomFor(s,1);
        }

        switch(*f) {
        case '%':
            next = *(f+1);
            if (next == '\0') break;
            f++;
            switch(next) {
            case 's':
            case 'S':
                str = va_arg(ap,char*);
                l = (next == 's') ? strlen(str) : sdslen(str);
                if (sdsavail(s) < l) {
                    s = sdsMakeRoomFor(s,l);
                }
                memcpy(s+i,str,l);
                sdsinclen(s,l);
                i += l;
                break;
            case 'i':
            case 'I':
                if (next == 'i')
                    num = va_arg(ap,int);
                else
                    num = va_arg(ap,long long);
                {
                    char buf[SDS_LLSTR_SIZE];
                    l = sdsll2str(buf,num);
                    if (sdsavail(s) < l) {
                        s = sdsMakeRoomFor(s,l);
                    }
                    memcpy(s+i,buf,l);
                    sdsinclen(s,l);
                    i += l;
                }
                break;
            case 'u':
            case 'U':
                if (next == 'u')
                    unum = va_arg(ap,unsigned int);
                else
                    unum = va_arg(ap,unsigned long long);
                {
                    char buf[SDS_LLSTR_SIZE];
                    l = sdsull2str(buf,unum);
                    if (sdsavail(s) < l) {
                        s = sdsMakeRoomFor(s,l);
                    }
                    memcpy(s+i,buf,l);
                    sdsinclen(s,l);
                    i += l;
                }
                break;
            default: /* Handle %% and generally %<unknown>. */
                s[i++] = next;
                sdsinclen(s,1);
                break;
            }
            break;
        default:
            s[i++] = *f;
            sdsinclen(s,1);
            break;
        }
        f++;
    }
    va_end(ap);

    /* Add null-term */
    s[i] = '\0';
    return s;
}